

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,int *iRow,int *hint)

{
  HVector **ppHVar1;
  double *__args;
  double dVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  bool bVar10;
  pointer ppVar11;
  pointer ppVar12;
  vector<int,std::allocator<int>> *this_00;
  int iVar13;
  HVector *pHVar14;
  ulong uVar15;
  pointer piVar16;
  int *piVar17;
  uint uVar18;
  ulong uVar19;
  pointer piVar20;
  pointer pdVar21;
  long lVar22;
  size_t sVar23;
  int *piVar24;
  int iVar25;
  size_type __new_size;
  vector<double,std::allocator<double>> *pvVar26;
  ulong uVar27;
  long lVar28;
  vector<int,_std::allocator<int>_> *pvVar29;
  vector<double,std::allocator<double>> *pvVar30;
  int iVar31;
  ulong uVar32;
  vector<int,std::allocator<int>> *pvVar33;
  long lVar34;
  int iVar35;
  pointer pdVar36;
  long lVar37;
  undefined8 uStack_150;
  pointer local_148;
  vector<int,std::allocator<int>> *local_140;
  vector<int,std::allocator<int>> *local_138;
  vector<int,_std::allocator<int>_> *local_130;
  pointer ppStack_128;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  int local_104;
  ulong local_100;
  vector<double,std::allocator<double>> *local_f8;
  vector<int,std::allocator<int>> *local_f0;
  vector<int,std::allocator<int>> *local_e8;
  vector<int,std::allocator<int>> *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  vector<int,std::allocator<int>> *local_d0;
  long local_c8;
  vector<double,std::allocator<double>> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  ulong uStack_b0;
  long local_a8;
  long local_a0;
  pointer local_98;
  undefined8 uStack_90;
  int *local_80;
  vector<double,std::allocator<double>> *local_78;
  ulong local_70;
  ulong local_68;
  vector<int,std::allocator<int>> *local_60;
  double local_58;
  undefined8 uStack_50;
  int local_48;
  int local_44;
  int UendX;
  int index_1;
  pair<int,_int> local_38;
  int index;
  
  uVar18 = 0;
  pHVar14 = aq;
  if (aq != (HVector *)0x0) {
    do {
      uVar18 = uVar18 + 1;
      ppHVar1 = &pHVar14->next;
      pHVar14 = *ppHVar1;
    } while (*ppHVar1 != (HVector *)0x0);
  }
  uVar32 = (ulong)uVar18;
  uVar15 = uVar32 * 8 + 0xf & 0xfffffffffffffff0;
  pvVar30 = (vector<double,std::allocator<double>> *)((long)&local_148 - uVar15);
  pvVar26 = pvVar30 + -uVar15;
  if (uVar18 != 0) {
    uVar19 = 0;
    do {
      *(HVector **)(pvVar30 + uVar19 * 8) = aq;
      *(HVector **)(pvVar26 + uVar19 * 8) = ep;
      aq = aq->next;
      ep = ep->next;
      uVar19 = uVar19 + 1;
    } while (uVar32 != uVar19);
  }
  local_78 = pvVar26;
  piVar16 = (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar34 = (long)pvVar26 - (uVar32 * 4 + 0xf & 0xfffffffffffffff0);
  uVar19 = lVar34 - uVar15;
  pdVar36 = (pointer)(uVar19 - uVar15);
  if (uVar32 != 0) {
    piVar20 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar21 = (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar27 = 0;
    do {
      iVar13 = iRow[uVar27];
      iVar31 = piVar20[iVar13];
      *(int *)(lVar34 + uVar27 * 4) = iVar31;
      *(double *)(uVar19 + uVar27 * 8) = pdVar21[iVar31];
      pdVar36[uVar27] =
           *(double *)(*(long *)(*(long *)(pvVar30 + uVar27 * 8) + 0x20) + (long)iVar13 * 8);
      uVar27 = uVar27 + 1;
    } while (uVar32 != uVar27);
  }
  local_148 = pdVar36;
  local_68 = uVar19;
  local_c0 = pvVar30;
  piVar20 = (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar19 = uVar32 * 4 + 0x13 & 0xfffffffffffffff0;
  local_a8 = (long)pdVar36 - uVar19;
  lVar28 = local_a8 - uVar15;
  local_a0 = lVar28;
  *(int *)((long)pdVar36 - uVar19) =
       (int)((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  ppStack_128 = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar32 != 0) {
    local_138 = (vector<int,std::allocator<int>> *)&this->PFpivotIndex;
    local_140 = (vector<int,std::allocator<int>> *)&this->Uindex;
    local_60 = (vector<int,std::allocator<int>> *)&this->iwork;
    local_f8 = (vector<double,std::allocator<double>> *)&this->Uvalue;
    local_f0 = (vector<int,std::allocator<int>> *)&this->PFindex;
    local_e8 = (vector<int,std::allocator<int>> *)&this->PFvalue;
    local_130 = &this->PFstart;
    local_100 = (long)(int)((ulong)((long)piVar16 - (long)piVar20) >> 2);
    _UendX = 0;
    local_c8 = lVar34;
    local_80 = iRow;
    local_70 = uVar32;
    do {
      piVar16 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar16) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar16;
      }
      lVar22 = *(long *)(local_c0 + _UendX * 8);
      if (0 < *(int *)(lVar22 + 0x84)) {
        lVar37 = 0;
        do {
          pvVar33 = local_60;
          iVar13 = *(int *)(*(long *)(lVar22 + 0x88) + lVar37 * 4);
          local_38.first = iVar13;
          local_58 = *(double *)(*(long *)(lVar22 + 0xa0) + lVar37 * 8);
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)(lVar28 + -8) = 0x12298b;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar33,iVar4,&local_38.first);
          }
          else {
            *iVar4._M_current = iVar13;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_38.first] = local_58;
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)(lVar22 + 0x84));
      }
      piVar17 = local_80;
      if (_UendX != 0) {
        uVar15 = 0;
        do {
          pvVar33 = local_60;
          iVar13 = piVar17[uVar15];
          local_38.first = iVar13;
          pdVar36 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_58 = pdVar36[iVar13];
          piVar16 = (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar31 = piVar16[uVar15 + local_100];
          lVar22 = (long)iVar31;
          iVar25 = piVar16[uVar15 + local_100 + 1];
          if (iVar31 < iVar25) {
            do {
              local_58 = local_58 -
                         pdVar36[(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar22]] *
                         (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar22];
              lVar22 = lVar22 + 1;
            } while (iVar25 != lVar22);
          }
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)(lVar28 + -8) = 0x122a3f;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar33,iVar4,&local_38.first);
          }
          else {
            *iVar4._M_current = iVar13;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_38.first] = local_58;
          uVar15 = uVar15 + 1;
        } while (uVar15 != _UendX);
      }
      pvVar33 = local_140;
      iVar13 = piVar17[_UendX];
      pdVar36 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e0 = (vector<int,std::allocator<int>> *)pdVar36[iVar13];
      pdVar36[iVar13] = 0.0;
      local_d8 = (vector<int,_std::allocator<int>_> *)(long)*(int *)(local_a8 + _UendX * 4);
      piVar16 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar20 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar20 != piVar16) {
        uVar15 = 0;
        uVar32 = 1;
        do {
          local_44 = piVar16[uVar15];
          pdVar36 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_38 = *(pair<int,_int> *)(pdVar36 + local_44);
          pdVar36[local_44] = 0.0;
          if (1e-14 < ABS((double)local_38)) {
            iVar4._M_current =
                 (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)(lVar28 + -8) = 0x122b10;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar33,iVar4,&local_44);
            }
            else {
              *iVar4._M_current = local_44;
              (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            pvVar26 = local_f8;
            iVar5._M_current =
                 (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)(lVar28 + -8) = 0x122b46;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar26,iVar5,(double *)&local_38);
            }
            else {
              *iVar5._M_current = (double)local_38;
              (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
          }
          piVar16 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar20 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar10 = uVar32 < (ulong)((long)piVar20 - (long)piVar16 >> 2);
          uVar15 = uVar32;
          uVar32 = (ulong)((int)uVar32 + 1);
        } while (bVar10);
      }
      pvVar33 = (vector<int,std::allocator<int>> *)
                ((ulong)((long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
      *(int *)(local_a8 + 4 + _UendX * 4) = (int)pvVar33;
      local_b8 = *(vector<int,_std::allocator<int>_> **)(local_68 + _UendX * 8);
      uStack_b0 = 0;
      *(double *)(local_a0 + _UendX * 8) = local_148[_UendX] * (double)local_b8;
      if (piVar20 != piVar16) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar16;
      }
      lVar22 = *(long *)(local_78 + _UendX * 8);
      if (0 < *(int *)(lVar22 + 0x84)) {
        lVar37 = 0;
        do {
          this_00 = local_60;
          iVar13 = *(int *)(*(long *)(lVar22 + 0x88) + lVar37 * 4);
          local_38.first = iVar13;
          local_58 = *(double *)(*(long *)(lVar22 + 0xa0) + lVar37 * 8);
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)(lVar28 + -8) = 0x122c1a;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this_00,iVar4,&local_38.first);
          }
          else {
            *iVar4._M_current = iVar13;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_38.first] = local_58;
          lVar37 = lVar37 + 1;
        } while (lVar37 < *(int *)(lVar22 + 0x84));
      }
      local_d0 = pvVar33;
      piVar17 = local_80;
      if (_UendX != 0) {
        uVar15 = 0;
        do {
          lVar34 = (long)ppStack_128[uVar15].second;
          iVar13 = local_80[lVar34];
          dVar2 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar13];
          uStack_90 = 0;
          if ((1e-14 < ABS(dVar2)) &&
             (lVar22 = *(long *)(local_78 + lVar34 * 8), 0 < *(int *)(lVar22 + 0x84))) {
            local_98 = (pointer)(dVar2 * -*(double *)(local_68 + lVar34 * 8));
            uStack_90 = 0;
            lVar34 = 0;
            do {
              pvVar33 = local_60;
              iVar31 = *(int *)(*(long *)(lVar22 + 0x88) + lVar34 * 4);
              local_38.first = iVar31;
              local_58 = *(double *)(*(long *)(lVar22 + 0xa0) + lVar34 * 8);
              iVar4._M_current =
                   (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *(undefined8 *)(lVar28 + -8) = 0x122d0c;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar33,iVar4,&local_38.first);
              }
              else {
                *iVar4._M_current = iVar31;
                (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              pdVar36 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar36[local_38.first] = local_58 * (double)local_98 + pdVar36[local_38.first];
              lVar34 = lVar34 + 1;
            } while (lVar34 < *(int *)(lVar22 + 0x84));
          }
          piVar17 = local_80;
          lVar34 = local_c8;
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar13] = 0.0;
          uVar15 = uVar15 + 1;
        } while (uVar15 != _UendX);
        uVar15 = 0;
        do {
          pvVar33 = local_60;
          iVar13 = piVar17[uVar15];
          local_38.first = iVar13;
          pdVar36 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_58 = pdVar36[iVar13];
          iVar31 = *(int *)(local_a8 + uVar15 * 4);
          lVar22 = (long)iVar31;
          iVar25 = *(int *)(local_a8 + 4 + uVar15 * 4);
          if (iVar31 < iVar25) {
            do {
              local_58 = local_58 -
                         pdVar36[(this->Uindex).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar22]] *
                         (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar22];
              lVar22 = lVar22 + 1;
            } while (iVar25 != lVar22);
          }
          local_98 = *(pointer *)(local_a0 + uVar15 * 8);
          iVar4._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *(undefined8 *)(lVar28 + -8) = 0x122dec;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar33,iVar4,&local_38.first);
          }
          else {
            *iVar4._M_current = iVar13;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_38.first] = local_58 / (double)local_98;
        } while (uVar15 != _UendX);
      }
      dVar2 = 0.0;
      if ((int)local_d8 < (int)local_d0) {
        pvVar29 = local_d8;
        dVar2 = 0.0;
        do {
          dVar2 = dVar2 + (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)pvVar29]] *
                          (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[(long)pvVar29];
          pvVar29 = (vector<int,_std::allocator<int>_> *)
                    ((long)&(pvVar29->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1);
        } while ((vector<int,_std::allocator<int>_> *)(long)(int)local_d0 != pvVar29);
      }
      piVar24 = piVar17 + _UendX;
      *(double *)(local_a0 + _UendX * 8) = dVar2 * (double)local_b8 + (double)local_e0;
      (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[*piVar24] = 0.0;
      piVar16 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar16) {
        local_b8 = (vector<int,_std::allocator<int>_> *)((ulong)local_b8 ^ 0x8000000000000000);
        uStack_b0 = uStack_b0 ^ 0x8000000000000000;
        uVar15 = 0;
        uVar32 = 1;
        do {
          pvVar33 = local_f0;
          local_44 = piVar16[uVar15];
          pdVar36 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_58 = pdVar36[local_44];
          pdVar36[local_44] = 0.0;
          uStack_50 = 0;
          if (1e-14 < ABS(local_58)) {
            iVar4._M_current =
                 (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)(lVar28 + -8) = 0x122f16;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar33,iVar4,&local_44);
            }
            else {
              *iVar4._M_current = local_44;
              (this->PFindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            pvVar33 = local_e8;
            local_38 = (pair<int,_int>)(local_58 * (double)local_b8);
            iVar5._M_current =
                 (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *(undefined8 *)(lVar28 + -8) = 0x122f59;
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)pvVar33,iVar5,
                         (double *)&local_38);
            }
            else {
              *iVar5._M_current = (double)local_38;
              (this->PFvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
          }
          piVar16 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar10 = uVar32 < (ulong)((long)(this->iwork).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar16 >> 2);
          uVar15 = uVar32;
          uVar32 = (ulong)((int)uVar32 + 1);
        } while (bVar10);
      }
      pvVar33 = local_138;
      iVar4._M_current =
           (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x122fac;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar33,iVar4,piVar24);
      }
      else {
        *iVar4._M_current = *piVar24;
        (this->PFpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      uVar15 = local_70;
      pvVar29 = local_130;
      iVar4._M_current =
           (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      iVar13 = (int)((ulong)((long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->PFindex).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      this->FtotalX = (this->FtotalX - iVar4._M_current[-1]) + iVar13 + 1;
      this->UtotalX = this->UtotalX + (iVar13 - iVar4._M_current[-1]);
      local_38.first = iVar13;
      if (iVar4._M_current ==
          (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x12300f;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pvVar29,iVar4,&local_38.first);
      }
      else {
        *iVar4._M_current = iVar13;
        (this->PFstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      ppVar11 = sorted_pp.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_38 = (pair<int,_int>)(_UendX << 0x20 | (ulong)*(uint *)(lVar34 + _UendX * 4));
      if (sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        *(undefined8 *)(lVar28 + -8) = 0x123050;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&ppStack_128,
                   (iterator)ppVar11,&local_38);
      }
      else {
        *sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start = local_38;
        sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             sorted_pp.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      ppVar12 = sorted_pp.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVar11 = ppStack_128;
      if (ppStack_128 !=
          sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar15 = (long)sorted_pp.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)ppStack_128 >> 3;
        lVar22 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar22 == 0; lVar22 = lVar22 + -1) {
          }
        }
        *(undefined8 *)(lVar28 + -8) = 0x12308b;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar11,ppVar12,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
        uVar15 = local_70;
        *(undefined8 *)(lVar28 + -8) = 0x12309d;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar11,ppVar12);
      }
      _UendX = _UendX + 1;
    } while (_UendX != uVar15);
    local_e0 = (vector<int,std::allocator<int>> *)&this->URlastp;
    local_e8 = (vector<int,std::allocator<int>> *)&this->URstart;
    local_f0 = (vector<int,std::allocator<int>> *)&this->Ulastp;
    local_f8 = (vector<double,std::allocator<double>> *)&this->Ustart;
    local_b8 = &this->URindex;
    local_78 = (vector<double,std::allocator<double>> *)&this->URvalue;
    local_d8 = &this->URspace;
    local_d0 = (vector<int,std::allocator<int>> *)&this->UpivotIndex;
    local_c0 = (vector<double,std::allocator<double>> *)&this->UpivotValue;
    uVar15 = 0;
    do {
      iVar13 = piVar17[uVar15];
      local_38.first = iVar13;
      local_68 = uVar15;
      local_58 = (double)(long)*(int *)(lVar34 + uVar15 * 4);
      local_98 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar16 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      this->FtotalX = this->FtotalX + (local_98[(long)local_58] - piVar16[(long)local_58]);
      this->UtotalX = this->UtotalX + (local_98[(long)local_58] - piVar16[(long)local_58]);
      lVar34 = (long)local_98[(long)local_58];
      if (local_98[(long)local_58] < piVar16[(long)local_58]) {
        piVar20 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar36 = (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar31 = piVar6[piVar20[lVar34]];
          iVar25 = piVar7[iVar31];
          iVar3 = piVar8[iVar31];
          piVar8[iVar31] = iVar3 + -1;
          iVar31 = iVar25;
          if (iVar25 < iVar3) {
            piVar17 = piVar9 + iVar25;
            do {
              iVar31 = iVar25;
              if (*piVar17 == iVar13) break;
              iVar25 = iVar25 + 1;
              piVar17 = piVar17 + 1;
              iVar31 = iVar3;
            } while (iVar3 != iVar25);
          }
          piVar9[iVar31] = piVar9[(long)iVar3 + -1];
          pdVar36[iVar31] = pdVar36[(long)iVar3 + -1];
          lVar34 = lVar34 + 1;
        } while (lVar34 < piVar16[(long)local_58]);
      }
      piVar20 = (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->FtotalX = this->FtotalX + (piVar20[(long)local_58] - piVar6[(long)local_58]);
      this->UtotalX = this->UtotalX + (piVar20[(long)local_58] - piVar6[(long)local_58]);
      lVar34 = (long)piVar20[(long)local_58];
      if (piVar20[(long)local_58] < piVar6[(long)local_58]) {
        piVar20 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar7 = (this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar36 = (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          iVar31 = piVar20[piVar7[lVar34]];
          iVar25 = local_98[iVar31];
          iVar3 = piVar16[iVar31];
          piVar16[iVar31] = iVar3 + -1;
          iVar35 = iVar25;
          if (iVar25 < iVar3) {
            piVar17 = piVar8 + iVar25;
            do {
              iVar35 = iVar25;
              if (*piVar17 == iVar13) break;
              iVar25 = iVar25 + 1;
              piVar17 = piVar17 + 1;
              iVar35 = iVar3;
            } while (iVar3 != iVar25);
          }
          piVar17 = piVar9 + iVar31;
          *piVar17 = *piVar17 + 1;
          piVar8[iVar35] = piVar8[(long)iVar3 + -1];
          pdVar36[iVar35] = pdVar36[(long)iVar3 + -1];
          lVar34 = lVar34 + 1;
        } while (lVar34 < piVar6[(long)local_58]);
      }
      local_44 = *(int *)(local_a8 + uVar15 * 4);
      lVar34 = (long)local_44;
      local_48 = *(int *)(local_a8 + 4 + uVar15 * 4);
      this->FtotalX = this->FtotalX + (local_48 - local_44) + 1;
      this->UtotalX = this->UtotalX + (local_48 - local_44);
      uVar32 = local_70;
      if (local_44 < local_48) {
        do {
          pvVar29 = local_b8;
          iVar13 = (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->Uindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar34]];
          if ((this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar13] == 0) {
            iVar31 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar13];
            local_98 = (pointer)(long)iVar31;
            iVar25 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar13];
            local_60 = (vector<int,std::allocator<int>> *)(long)iVar25;
            uVar18 = iVar25 - iVar31;
            _UendX = (ulong)uVar18;
            uVar18 = (uint)((double)(int)uVar18 * 1.1 + 5.0);
            local_100 = (ulong)uVar18;
            iVar31 = (int)((ulong)((long)(this->URindex).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->URindex).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            __new_size = (size_type)(int)(uVar18 + iVar31);
            *(undefined8 *)(lVar28 + -8) = 0x1233ae;
            std::vector<int,_std::allocator<int>_>::resize(pvVar29,__new_size);
            pvVar26 = local_78;
            *(undefined8 *)(lVar28 + -8) = 0x1233ba;
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)pvVar26,__new_size);
            sVar23 = (long)local_60 * 4 + (long)local_98 * -4;
            if (sVar23 != 0) {
              piVar16 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              piVar20 = piVar16 + (long)local_98;
              *(undefined8 *)(lVar28 + -8) = 0x1233f3;
              memmove(piVar16 + iVar31,piVar20,sVar23);
            }
            sVar23 = (long)local_60 * 8 + (long)local_98 * -8;
            if (sVar23 != 0) {
              pdVar36 = (((_Vector_base<double,_std::allocator<double>_> *)&local_78->field_0x0)->
                        _M_impl).super__Vector_impl_data._M_start;
              pdVar21 = pdVar36 + (long)local_98;
              *(undefined8 *)(lVar28 + -8) = 0x123424;
              memmove(pdVar36 + iVar31,pdVar21,sVar23);
            }
            (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar13] = iVar31;
            (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar13] = (int)_UendX + iVar31;
            (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar13] = (int)local_100 - (int)_UendX;
            uVar32 = local_70;
          }
          piVar17 = (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar13;
          *piVar17 = *piVar17 + -1;
          piVar16 = (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar31 = piVar16[iVar13];
          piVar16[iVar13] = iVar31 + 1;
          (this->URindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar31] = local_38.first;
          (this->URvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar31] =
               (this->Uvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar34];
          lVar34 = lVar34 + 1;
        } while (lVar34 < local_48);
      }
      pvVar26 = local_f8;
      iVar4._M_current =
           (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x1234ea;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)pvVar26,iVar4,&local_44);
      }
      else {
        *iVar4._M_current = local_44;
        (this->Ustart).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar4._M_current + 1;
      }
      piVar17 = local_80;
      lVar34 = local_c8;
      pvVar33 = local_f0;
      iVar4._M_current =
           (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x123527;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar33,iVar4,&local_48)
        ;
      }
      else {
        *iVar4._M_current = local_48;
        (this->Ulastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar4._M_current + 1;
      }
      dVar2 = local_58;
      pvVar33 = local_e8;
      piVar24 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (long)local_58;
      iVar4._M_current =
           (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x12356a;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar33,iVar4,piVar24);
      }
      else {
        *iVar4._M_current = *piVar24;
        (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pvVar33 = local_e0;
      piVar24 = (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (long)dVar2;
      iVar4._M_current =
           (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x1235a2;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar33,iVar4,piVar24);
      }
      else {
        *iVar4._M_current = *piVar24;
        (this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pvVar29 = local_d8;
      local_104 = ((this->URlastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)local_58] +
                  (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_58]) -
                  (this->URstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_58];
      iVar4._M_current =
           (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x1235fc;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar29,iVar4,&local_104);
      }
      else {
        *iVar4._M_current = local_104;
        (this->URspace).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pvVar33 = local_d0;
      iVar4._M_current =
           (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar16 = (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->UpivotLookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[local_38.first] =
           (int)((ulong)((long)iVar4._M_current - (long)piVar16) >> 2);
      piVar16[(long)local_58] = -1;
      if (iVar4._M_current ==
          (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x123658;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar33,iVar4,&local_38.first);
      }
      else {
        *iVar4._M_current = local_38.first;
        (this->UpivotIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pvVar26 = local_c0;
      __args = (double *)(local_a0 + local_68 * 8);
      iVar5._M_current =
           (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *(undefined8 *)(lVar28 + -8) = 0x123698;
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (pvVar26,iVar5,__args);
      }
      else {
        *iVar5._M_current = *__args;
        (this->UpivotValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      uVar15 = local_68 + 1;
    } while (uVar15 != uVar32);
  }
  ppVar11 = ppStack_128;
  if (ppStack_128 != (pointer)0x0) {
    *(undefined8 *)(lVar28 + -8) = 0x1236b9;
    operator_delete(ppVar11);
  }
  return;
}

Assistant:

void HFactor::updateCFT(HVector *aq, HVector *ep, int *iRow, int *hint) {

    /*
     * In the major update loop, the prefix
     *
     * c(p) = current working pivot
     * p(p) = previous pivot  (0 =< pp < cp)
     */

    int numUpdate = 0;
    for (HVector *vec = aq; vec != 0; vec = vec->next)
        numUpdate++;

    HVector* aqWork[numUpdate];
    HVector* epWork[numUpdate];

    for (int i = 0; i < numUpdate; i++) {
        aqWork[i] = aq;
        epWork[i] = ep;
        aq = aq->next;
        ep = ep->next;
    }

    // Pivot related buffers
    int PFnp0 = PFpivotIndex.size();
    int pLogic[numUpdate];
    double pValue[numUpdate];
    double pAlpha[numUpdate];
    for (int cp = 0; cp < numUpdate; cp++) {
        int cRow = iRow[cp];
        int iLogic = UpivotLookup[cRow];
        pLogic[cp] = iLogic;
        pValue[cp] = UpivotValue[iLogic];
        pAlpha[cp] = aqWork[cp]->array[cRow];
    }

    // Temporary U pointers
    int Tstart[numUpdate + 1];
    double Tpivot[numUpdate];
    Tstart[0] = Uindex.size();

    // Logically sorted previous row_ep
    vector<pair<int, int> > sorted_pp;

    // Major update loop
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Expand partial FTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < aqWork[cp]->packCount; i++) {
            int index = aqWork[cp]->packIndex[i];
            double value = aqWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 2. Update partial FTRAN result by recent FT matrix
        for (int pp = 0; pp < cp; pp++) {
            int pRow = iRow[pp];
            double value = dwork[pRow];
            int PFpp = pp + PFnp0;
            for (int i = PFstart[PFpp]; i < PFstart[PFpp + 1]; i++)
                value -= dwork[PFindex[i]] * PFvalue[i];
            iwork.push_back(pRow); // OK to duplicate
            dwork[pRow] = value;
        }

        // 3. Store the partial FTRAN result to matirx U
        double ppaq = dwork[iRow[cp]]; // pivot of the partial aq
        dwork[iRow[cp]] = 0;
        int UcountX = Tstart[cp];
        int UstartX = UcountX;
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0; // This effectively removes all duplication
            if (fabs(value) > HSOL_CONST_TINY) {
                Uindex.push_back(index);
                Uvalue.push_back(value);
            }
        }
        UcountX = Uindex.size();
        Tstart[cp + 1] = UcountX;
        Tpivot[cp] = pValue[cp] * pAlpha[cp];

        // 4. Expand partial BTRAN result to buffer
        iwork.clear();
        for (int i = 0; i < epWork[cp]->packCount; i++) {
            int index = epWork[cp]->packIndex[i];
            double value = epWork[cp]->packValue[i];
            iwork.push_back(index);
            dwork[index] = value;
        }

        // 5. Delete logical later rows (in logical order)
        for (int isort = 0; isort < cp; isort++) {
            int pp = sorted_pp[isort].second;
            int pRow = iRow[pp];
            double multiplier = -pValue[pp] * dwork[pRow];
            if (fabs(dwork[pRow]) > HSOL_CONST_TINY) {
                for (int i = 0; i < epWork[pp]->packCount; i++) {
                    int index = epWork[pp]->packIndex[i];
                    double value = epWork[pp]->packValue[i];
                    iwork.push_back(index);
                    dwork[index] += value * multiplier;
                }
            }
            dwork[pRow] = 0; // Force to be 0
        }

        // 6. Update partial BTRAN result by recent U columns
        for (int pp = 0; pp < cp; pp++) {
            int kpivot = iRow[pp];
            double value = dwork[kpivot];
            for (int k = Tstart[pp]; k < Tstart[pp + 1]; k++)
                value -= dwork[Uindex[k]] * Uvalue[k];
            value /= Tpivot[pp];
            iwork.push_back(kpivot);
            dwork[kpivot] = value; // Again OK to duplicate
        }

        // 6.x compute current alpha
        double thex = 0;
        for (int k = UstartX; k < UcountX; k++) {
            int index = Uindex[k];
            double value = Uvalue[k];
            thex += dwork[index] * value;
        }
        Tpivot[cp] = ppaq + thex * pValue[cp];

        // 7. Store BTRAN result to FT elimination, update logic helper
        dwork[iRow[cp]] = 0;
        double pivotX = -pValue[cp];
        for (unsigned i = 0; i < iwork.size(); i++) {
            int index = iwork[i];
            double value = dwork[index];
            dwork[index] = 0;
            if (fabs(value) > HSOL_CONST_TINY) {
                PFindex.push_back(index);
                PFvalue.push_back(value * pivotX);
            }
        }
        PFpivotIndex.push_back(iRow[cp]);
        FtotalX += PFindex.size() - PFstart.back() + 1;
        UtotalX += PFindex.size() - PFstart.back();
        PFstart.push_back(PFindex.size());

        // 8. Update the sorted ep
        sorted_pp.push_back(make_pair(pLogic[cp], cp));
        sort(sorted_pp.begin(), sorted_pp.end());
    }

    // Now modify the U matrix
    for (int cp = 0; cp < numUpdate; cp++) {
        // 1. Delete pivotal row from U
        int cIndex = iRow[cp];
        int cLogic = pLogic[cp];
        FtotalX -= URlastp[cLogic] - URstart[cLogic];
        UtotalX -= URlastp[cLogic] - URstart[cLogic];
        for (int k = URstart[cLogic]; k < URlastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[URindex[k]];
            int iFind = Ustart[iLogic];
            int iLast = --Ulastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (Uindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            Uindex[iFind] = Uindex[iLast];
            Uvalue[iFind] = Uvalue[iLast];
        }

        // 2. Delete pivotal column from UR
        FtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        UtotalX -= Ulastp[cLogic] - Ustart[cLogic];
        for (int k = Ustart[cLogic]; k < Ulastp[cLogic]; k++) {
            // Find the pivotal position
            int iLogic = UpivotLookup[Uindex[k]];
            int iFind = URstart[iLogic];
            int iLast = --URlastp[iLogic];
            for (; iFind <= iLast; iFind++)
                if (URindex[iFind] == cIndex)
                    break;
            // Put last to find, and delete last
            URspace[iLogic]++;
            URindex[iFind] = URindex[iLast];
            URvalue[iFind] = URvalue[iLast];
        }

        // 3. Insert the (stored) partial FTRAN to the row matrix
        int UstartX = Tstart[cp];
        int UendX = Tstart[cp + 1];
        FtotalX += UendX - UstartX + 1;
        UtotalX += UendX - UstartX;
        // Store column as UR elements
        for (int k = UstartX; k < UendX; k++) {
            // Which ETA file
            int iLogic = UpivotLookup[Uindex[k]];

            // Move row to the end if necessary
            if (URspace[iLogic] == 0) {
                // Make pointers
                int row_start = URstart[iLogic];
                int row_count = URlastp[iLogic] - row_start;
                int new_start = URindex.size();
                int new_space = row_count * 1.1 + 5;

                // Check matrix UR
                URindex.resize(new_start + new_space);
                URvalue.resize(new_start + new_space);

                // Move elements
                int iFrom = row_start;
                int iEnd = row_start + row_count;
                int iTo = new_start;
                copy(&URindex[iFrom], &URindex[iEnd], &URindex[iTo]);
                copy(&URvalue[iFrom], &URvalue[iEnd], &URvalue[iTo]);

                // Save new pointers
                URstart[iLogic] = new_start;
                URlastp[iLogic] = new_start + row_count;
                URspace[iLogic] = new_space - row_count;
            }

            // Put into the next available space
            URspace[iLogic]--;
            int iPut = URlastp[iLogic]++;
            URindex[iPut] = cIndex;
            URvalue[iPut] = Uvalue[k];
        }

        // 4. Save pointers
        Ustart.push_back(UstartX);
        Ulastp.push_back(UendX);

        URstart.push_back(URstart[cLogic]);
        URlastp.push_back(URstart[cLogic]);
        URspace.push_back(URspace[cLogic] + URlastp[cLogic] - URstart[cLogic]);

        UpivotLookup[cIndex] = UpivotIndex.size();
        UpivotIndex[cLogic] = -1;
        UpivotIndex.push_back(cIndex);
        UpivotValue.push_back(Tpivot[cp]);
    }

//    // See if we want refactor
//    if (UtotalX > UmeritX && PFpivotIndex.size() > 100)
//        *hint = 1;

}